

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Scanner::scanToNextToken(Scanner *this)

{
  iterator Position;
  iterator pcVar1;
  
  while( true ) {
    while ((*this->Current == ' ' || (*this->Current == '\t'))) {
      skip(this,1);
    }
    skipComment(this);
    Position = this->Current;
    pcVar1 = skip_b_break(this,Position);
    if (pcVar1 == Position) break;
    this->Current = pcVar1;
    this->Line = this->Line + 1;
    this->Column = 0;
    if (this->FlowLevel == 0) {
      this->IsSimpleKeyAllowed = true;
    }
  }
  return;
}

Assistant:

void Scanner::scanToNextToken() {
  while (true) {
    while (*Current == ' ' || *Current == '\t') {
      skip(1);
    }

    skipComment();

    // Skip EOL.
    StringRef::iterator i = skip_b_break(Current);
    if (i == Current)
      break;
    Current = i;
    ++Line;
    Column = 0;
    // New lines may start a simple key.
    if (!FlowLevel)
      IsSimpleKeyAllowed = true;
  }
}